

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O0

Var Js::TaggedInt::Modulus(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  uint uVar2;
  int32 val;
  JavascriptLibrary *pJVar3;
  int64 right64;
  int64 left64;
  int result;
  int nRight;
  int nLeft;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  uVar2 = ToInt32(aLeft);
  val = ToInt32(aRight);
  if (((int)uVar2 < 1) || (bVar1 = ::Math::IsPow2(val), !bVar1)) {
    if (val == 0) {
      pJVar3 = ScriptContext::GetLibrary(scriptContext);
      aLeft_local = JavascriptLibraryBase::GetNaN(&pJVar3->super_JavascriptLibraryBase);
    }
    else if (uVar2 == 0) {
      aLeft_local = ToVarUnchecked(0);
    }
    else {
      left64._4_4_ = (int)uVar2 % val;
      if (left64._4_4_ == 0) {
        if ((int)uVar2 < 0) {
          pJVar3 = ScriptContext::GetLibrary(scriptContext);
          aLeft_local = JavascriptLibraryBase::GetNegativeZero(&pJVar3->super_JavascriptLibraryBase)
          ;
        }
        else {
          aLeft_local = ToVarUnchecked(0);
        }
      }
      else {
        aLeft_local = ToVarUnchecked(left64._4_4_);
      }
    }
  }
  else {
    aLeft_local = ToVarUnchecked(uVar2 & val - 1U);
  }
  return aLeft_local;
}

Assistant:

Var TaggedInt::Modulus(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        int nLeft    = ToInt32(aLeft);
        int nRight   = ToInt32(aRight);

        // nLeft is positive and nRight is +2^i
        // Fast path for Power of 2 divisor
        if (nLeft > 0 && ::Math::IsPow2(nRight))
        {
            return ToVarUnchecked(nLeft & (nRight - 1));
        }

        if (nRight == 0)
        {
            return scriptContext->GetLibrary()->GetNaN();
        }

        if (nLeft == 0)
        {
          return ToVarUnchecked(0);
        }
        int result;
#if INT32VAR
        // 0x80000000 / -1 (or %) will trigger an integer overflow exception
        if (nLeft != INT_MIN || nRight != -1)
        {
#endif
            result = nLeft % nRight;

#if INT32VAR
        }
        else
        {
            int64 left64 = nLeft;
            int64 right64 = nRight;
            result = (int)(left64 % right64);
        }
#endif
        if (result != 0)
        {
            return ToVarUnchecked(result);
        }
        else
        {
            //
            // return -0 if left is negative
            //

            if (nLeft >= 0)
            {
                return ToVarUnchecked(0);
            }
            else
            {
                return scriptContext->GetLibrary()->GetNegativeZero();
            }
        }
    }